

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

bool cfd::core::operator<=(OutPoint *source,OutPoint *dest)

{
  int iVar1;
  int comp;
  OutPoint *dest_local;
  OutPoint *source_local;
  
  iVar1 = OutPoint::Compare(source,dest);
  if (iVar1 == 0) {
    source_local._7_1_ = true;
  }
  else if (iVar1 < 1) {
    source_local._7_1_ = false;
  }
  else {
    source_local._7_1_ = true;
  }
  return source_local._7_1_;
}

Assistant:

bool operator<=(const OutPoint &source, const OutPoint &dest) {
  int comp = source.Compare(dest);
  if (comp == 0) {
    return true;
  } else if (comp > 0) {
    return true;
  } else {
    return false;
  }
}